

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void add_huff_table(j_compress_ptr cinfo,JHUFF_TBL **htblptr,UINT8 *bits,UINT8 *val)

{
  JHUFF_TBL *pJVar1;
  int local_30;
  int local_2c;
  int len;
  int nsymbols;
  UINT8 *val_local;
  UINT8 *bits_local;
  JHUFF_TBL **htblptr_local;
  j_compress_ptr cinfo_local;
  
  if (*htblptr == (JHUFF_TBL *)0x0) {
    pJVar1 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
    *htblptr = pJVar1;
  }
  pJVar1 = *htblptr;
  *(undefined8 *)pJVar1->bits = *(undefined8 *)bits;
  *(undefined8 *)(pJVar1->bits + 8) = *(undefined8 *)(bits + 8);
  pJVar1->bits[0x10] = bits[0x10];
  local_2c = 0;
  for (local_30 = 1; local_30 < 0x11; local_30 = local_30 + 1) {
    local_2c = (uint)bits[local_30] + local_2c;
  }
  if ((local_2c < 1) || (0x100 < local_2c)) {
    cinfo->err->msg_code = 9;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  memcpy((*htblptr)->huffval,val,(long)local_2c);
  (*htblptr)->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
add_huff_table (j_compress_ptr cinfo,
		JHUFF_TBL **htblptr, const UINT8 *bits, const UINT8 *val)
/* Define a Huffman table */
{
  int nsymbols, len;

  if (*htblptr == NULL)
    *htblptr = jpeg_alloc_huff_table((j_common_ptr) cinfo);

  /* Copy the number-of-symbols-of-each-code-length counts */
  MEMCOPY((*htblptr)->bits, bits, SIZEOF((*htblptr)->bits));

  /* Validate the counts.  We do this here mainly so we can copy the right
   * number of symbols from the val[] array, without risking marching off
   * the end of memory.  jchuff.c will do a more thorough test later.
   */
  nsymbols = 0;
  for (len = 1; len <= 16; len++)
    nsymbols += bits[len];
  if (nsymbols < 1 || nsymbols > 256)
    ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

  MEMCOPY((*htblptr)->huffval, val, nsymbols * SIZEOF(UINT8));

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*htblptr)->sent_table = FALSE;
}